

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O0

FT_String * tt_name_ascii_from_utf16(TT_Name entry,FT_Memory memory)

{
  ushort uVar1;
  int local_44;
  FT_Byte *pFStack_40;
  FT_Error error;
  FT_Byte *read;
  FT_UInt n;
  FT_UInt code;
  FT_UInt len;
  FT_String *string;
  FT_Memory memory_local;
  TT_Name entry_local;
  
  _code = 0;
  pFStack_40 = entry->string;
  n = (FT_UInt)(entry->stringLength >> 1);
  string = (FT_String *)memory;
  memory_local = (FT_Memory)entry;
  entry_local = (TT_Name)ft_mem_realloc(memory,1,0,(ulong)(n + 1),(void *)0x0,&local_44);
  if (local_44 == 0) {
    for (read._4_4_ = 0; read._4_4_ < n; read._4_4_ = read._4_4_ + 1) {
      uVar1 = CONCAT11(*pFStack_40,pFStack_40[1]);
      if (uVar1 == 0) break;
      if ((uVar1 < 0x20) || (0x7f < uVar1)) {
        uVar1 = 0x3f;
      }
      *(char *)((long)&entry_local->platformID + (ulong)read._4_4_) = (char)uVar1;
      pFStack_40 = pFStack_40 + 2;
    }
    *(undefined1 *)((long)&entry_local->platformID + (ulong)read._4_4_) = 0;
  }
  else {
    entry_local = (TT_Name)0x0;
  }
  return (FT_String *)entry_local;
}

Assistant:

static FT_String*
  tt_name_ascii_from_utf16( TT_Name    entry,
                            FT_Memory  memory )
  {
    FT_String*  string = NULL;
    FT_UInt     len, code, n;
    FT_Byte*    read   = (FT_Byte*)entry->string;
    FT_Error    error;


    len = (FT_UInt)entry->stringLength / 2;

    if ( FT_NEW_ARRAY( string, len + 1 ) )
      return NULL;

    for ( n = 0; n < len; n++ )
    {
      code = FT_NEXT_USHORT( read );

      if ( code == 0 )
        break;

      if ( code < 32 || code > 127 )
        code = '?';

      string[n] = (char)code;
    }

    string[n] = 0;

    return string;
  }